

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.h
# Opt level: O3

void __thiscall
oout::NamedTest::NamedTest<oout::ContainTest,oout::NamedTest,oout::NamedTest,oout::NamedTest>
          (NamedTest *this,string *name,shared_ptr<const_oout::Test> *test1,
          shared_ptr<const_oout::Test> *test2,shared_ptr<oout::ContainTest> *tests,
          shared_ptr<oout::NamedTest> *tests_1,shared_ptr<oout::NamedTest> *tests_2,
          shared_ptr<oout::NamedTest> *tests_3)

{
  undefined1 local_39;
  SuiteTest *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_oout::Test> local_28;
  
  local_38 = (SuiteTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuiteTest_const,std::allocator<oout::SuiteTest>,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::ContainTest>const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&>
            (&_Stack_30,&local_38,(allocator<oout::SuiteTest> *)&local_39,test1,test2,tests,tests_1,
             tests_2,tests_3);
  local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Test;
  local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (SuiteTest *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  NamedTest(this,name,&local_28);
  if (local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

NamedTest(
		const std::string &name,
		const std::shared_ptr<const Test> &test1,
		const std::shared_ptr<const Test> &test2,
		const std::shared_ptr<T> & ... tests
	) : NamedTest(name, std::make_shared<const SuiteTest>(test1, test2, tests...))
	{
	}